

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

DOMElement * __thiscall
xercesc_4_0::AbstractDOMParser::createElementNS
          (AbstractDOMParser *this,XMLCh *namespaceURI,XMLCh *elemPrefix,XMLCh *localName,
          XMLCh *qName)

{
  int iVar1;
  undefined4 extraout_var;
  DOMDocument *ownerDoc;
  
  iVar1 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[5])
                    (this->fDocument,0xb0,7);
  ownerDoc = &this->fDocument->super_DOMDocument;
  if (this->fDocument == (DOMDocumentImpl *)0x0) {
    ownerDoc = (DOMDocument *)0x0;
  }
  DOMElementNSImpl::DOMElementNSImpl
            ((DOMElementNSImpl *)CONCAT44(extraout_var,iVar1),ownerDoc,namespaceURI,elemPrefix,
             localName,qName);
  return (DOMElement *)(DOMElementNSImpl *)CONCAT44(extraout_var,iVar1);
}

Assistant:

DOMElement* AbstractDOMParser::
createElementNS (const XMLCh* namespaceURI,
                 const XMLCh* elemPrefix,
                 const XMLCh* localName,
                 const XMLCh* qName)
{
  return new (fDocument, DOMMemoryManager::ELEMENT_NS_OBJECT)
    DOMElementNSImpl (fDocument,
                      namespaceURI,
                      elemPrefix,
                      localName,
                      qName);
}